

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

void __thiscall
cmOutputConverter::cmOutputConverter(cmOutputConverter *this,cmStateSnapshot *snapshot)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  bool bVar2;
  
  (this->StateSnapshot).Position.Position = (snapshot->Position).Position;
  pcVar1 = (snapshot->Position).Tree;
  (this->StateSnapshot).State = snapshot->State;
  (this->StateSnapshot).Position.Tree = pcVar1;
  this->LinkScriptShell = false;
  (this->RelativePathTopSource)._M_dataplus._M_p = (pointer)&(this->RelativePathTopSource).field_2;
  (this->RelativePathTopSource)._M_string_length = 0;
  (this->RelativePathTopSource).field_2._M_local_buf[0] = '\0';
  (this->RelativePathTopBinary)._M_dataplus._M_p = (pointer)&(this->RelativePathTopBinary).field_2;
  (this->RelativePathTopBinary)._M_string_length = 0;
  (this->RelativePathTopBinary).field_2._M_local_buf[0] = '\0';
  this->RelativePathTopRelation = Separate;
  bVar2 = cmStateSnapshot::IsValid(&this->StateSnapshot);
  if (bVar2) {
    ComputeRelativePathTopSource(this);
    ComputeRelativePathTopBinary(this);
    ComputeRelativePathTopRelation(this);
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmOutputConverter.cxx"
                ,0x21,"cmOutputConverter::cmOutputConverter(const cmStateSnapshot &)");
}

Assistant:

cmOutputConverter::cmOutputConverter(cmStateSnapshot const& snapshot)
  : StateSnapshot(snapshot)
{
  assert(this->StateSnapshot.IsValid());
  this->ComputeRelativePathTopSource();
  this->ComputeRelativePathTopBinary();
  this->ComputeRelativePathTopRelation();
}